

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void * thread_init(_func_void_void_ptr *threadfunc,void *u)

{
  int iVar1;
  undefined8 *__arg;
  long in_FS_OFFSET;
  pthread_t id;
  pthread_attr_t attr;
  void *local_60;
  pthread_attr_t local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  __arg = (undefined8 *)malloc(0x10);
  *__arg = threadfunc;
  __arg[1] = u;
  pthread_attr_init(&local_58);
  iVar1 = pthread_create((pthread_t *)&local_60,&local_58,thread_run,__arg);
  if (iVar1 != 0) {
    local_60 = (void *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return local_60;
}

Assistant:

void *thread_init(void (*threadfunc)(void *), void *u)
{
	struct THREAD_RUN *data = malloc(sizeof(*data));
	data->threadfunc = threadfunc;
	data->u = u;
#if defined(CONF_FAMILY_UNIX)
	{
		pthread_t id;
		pthread_attr_t attr;
		pthread_attr_init(&attr);
#if defined(CONF_PLATFORM_MACOS)
		pthread_attr_set_qos_class_np(&attr, QOS_CLASS_USER_INTERACTIVE, 0);
#endif
		if(pthread_create(&id, &attr, thread_run, data) != 0)
		{
			return 0;
		}
		return (void*)id;
	}
#elif defined(CONF_FAMILY_WINDOWS)
	return CreateThread(NULL, 0, thread_run, data, 0, NULL);
#else
	#error not implemented
#endif
}